

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

Stream * rw::readHAnim(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  int32 iVar1;
  int32 flags_00;
  int32 maxKeySize_00;
  int32 iVar2;
  int32 *piVar3;
  int32 *nodeFlags_00;
  int32 *nodeIDs_00;
  HAnimHierarchy *pHVar4;
  int local_54;
  int32 i;
  int32 *nodeIDs;
  int32 *nodeFlags;
  int32 maxKeySize;
  int32 flags;
  HAnimData *hanim;
  int32 numNodes;
  int32 ver;
  int32 param_4_local;
  int32 offset_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  piVar3 = (int32 *)((long)object + (long)offset);
  Stream::readI32(stream);
  iVar1 = Stream::readI32(stream);
  *piVar3 = iVar1;
  iVar1 = Stream::readI32(stream);
  if (iVar1 != 0) {
    flags_00 = Stream::readI32(stream);
    maxKeySize_00 = Stream::readI32(stream);
    nodeFlags_00 = (int32 *)mustmalloc_LOC((long)iVar1 << 2,0x1011e,
                                           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 266"
                                          );
    nodeIDs_00 = (int32 *)mustmalloc_LOC((long)iVar1 << 2,0x1011e,
                                         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/hanim.cpp line: 268"
                                        );
    for (local_54 = 0; local_54 < iVar1; local_54 = local_54 + 1) {
      iVar2 = Stream::readI32(stream);
      nodeIDs_00[local_54] = iVar2;
      Stream::readI32(stream);
      iVar2 = Stream::readI32(stream);
      nodeFlags_00[local_54] = iVar2;
    }
    pHVar4 = HAnimHierarchy::create(iVar1,nodeFlags_00,nodeIDs_00,flags_00,maxKeySize_00);
    *(HAnimHierarchy **)(piVar3 + 2) = pHVar4;
    *(void **)(*(long *)(piVar3 + 2) + 0x20) = object;
    (*DAT_001660a8)(nodeFlags_00);
    (*DAT_001660a8)(nodeIDs_00);
  }
  return stream;
}

Assistant:

static Stream*
readHAnim(Stream *stream, int32, void *object, int32 offset, int32)
{
	int32 ver, numNodes;
	HAnimData *hanim = PLUGINOFFSET(HAnimData, object, offset);
	ver = stream->readI32();
	assert(ver == 0x100);
	hanim->id = stream->readI32();
	numNodes = stream->readI32();
	if(numNodes != 0){
		int32 flags = stream->readI32();
		int32 maxKeySize = stream->readI32();
		// Sizes are fucked for 64 bit pointers but
		// AnimInterpolator::create() will take care of that
		int32 *nodeFlags = rwNewT(int32, numNodes,
			MEMDUR_FUNCTION | ID_HANIM);
		int32 *nodeIDs = rwNewT(int32, numNodes,
			MEMDUR_FUNCTION | ID_HANIM);
		for(int32 i = 0; i < numNodes; i++){
			nodeIDs[i] = stream->readI32();
			stream->readI32();	// index...unused
			nodeFlags[i] = stream->readI32();
		}
		hanim->hierarchy = HAnimHierarchy::create(numNodes,
			nodeFlags, nodeIDs, flags, maxKeySize);
		hanim->hierarchy->parentFrame = (Frame*)object;
		rwFree(nodeFlags);
		rwFree(nodeIDs);
	}
	return stream;
}